

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::CreateImageGLES2::CreateImageGLES2
          (CreateImageGLES2 *this,EglTestContext *eglTestCtx,EGLint target,GLenum internalFormat,
          GLenum format,GLenum type,bool useTexLevel0)

{
  _Alloc_hider _Var1;
  char *pcVar2;
  allocator<char> local_f2;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"create_image_gles2_",&local_f1);
  pcVar2 = getTargetName(target);
  std::operator+(&local_90,&local_b0,pcVar2);
  std::operator+(&local_70,&local_90,"_");
  pcVar2 = getStorageName(internalFormat);
  std::operator+(&local_50,&local_70,pcVar2);
  pcVar2 = glcts::fixed_sample_locations_values + 1;
  if (useTexLevel0) {
    pcVar2 = "_level0_only";
  }
  std::operator+(&local_f0,&local_50,pcVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Create EGLImage from GLES2 object",&local_f2);
  ImageTestCase::ImageTestCase
            (&this->super_ImageTestCase,eglTestCtx,(ApiType)0x2,&local_f0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CreateImageGLES2_01e0eb80;
  getImageSource((MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
                  *)&local_f0,this,target,internalFormat,format,type,useTexLevel0);
  _Var1._M_p = local_f0._M_dataplus._M_p;
  local_f0._M_dataplus._M_p = (pointer)0x0;
  (this->m_source).
  super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  .m_data.ptr = (ImageSource *)_Var1._M_p;
  de::details::
  UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>::
  ~UniqueBase((UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
               *)&local_f0);
  this->m_internalFormat = internalFormat;
  return;
}

Assistant:

CreateImageGLES2 (EglTestContext& eglTestCtx, EGLint target, GLenum internalFormat, GLenum format, GLenum type, bool useTexLevel0 = false)
		: ImageTestCase		(eglTestCtx, ApiType::es(2, 0), string("create_image_gles2_") + getTargetName(target) + "_" + getStorageName(internalFormat) + (useTexLevel0 ? "_level0_only" : ""), "Create EGLImage from GLES2 object")
		, m_source			(getImageSource(target, internalFormat, format, type, useTexLevel0))
		, m_internalFormat	(internalFormat)
	{
	}